

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astContinueNode_primitiveEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  sysbvm_stackFrameRecord_t *targetRecord;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = *(sysbvm_tuple_t *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sVar1 = sysbvm_environment_lookContinueTargetRecursively(context,arguments[1]);
  if (sVar1 == 0) {
    sysbvm_error("No target available for continue.");
  }
  else if ((sVar1 & 0xf) == 0) {
    targetRecord = *(sysbvm_stackFrameRecord_t **)(sVar1 + 0x10);
    goto LAB_0011d402;
  }
  targetRecord = (sysbvm_stackFrameRecord_t *)((long)sVar1 >> 4);
LAB_0011d402:
  sysbvm_stackFrame_continueInto(targetRecord);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astContinueNode_primitiveEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astContinueNode_t **continueNode = (sysbvm_astContinueNode_t**)node;
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*continueNode)->super.sourcePosition);

    sysbvm_tuple_t continueTarget = sysbvm_environment_lookContinueTargetRecursively(context, *environment);
    if(!continueTarget)
        sysbvm_error("No target available for continue.");

    sysbvm_stackFrame_continueInto((sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(continueTarget));
    return SYSBVM_NULL_TUPLE;
}